

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O2

void __thiscall Minisat::IntOption::printOptionCall(IntOption *this,stringstream *s)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)(s + 0x10),"-");
  poVar1 = std::operator<<(poVar1,(this->super_Option).name);
  poVar1 = std::operator<<(poVar1,"=");
  std::ostream::operator<<((ostream *)poVar1,this->value);
  return;
}

Assistant:

virtual void printOptionCall(std::stringstream &s) { s << "-" << name << "=" << value; }